

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

char * QtPrivate::QTypeNormalizer::skipString(char *x,char *e)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = x;
  do {
    pcVar1 = pcVar2;
    pcVar2 = pcVar1 + 1;
    if ((pcVar2 == e) || (*pcVar2 == *x)) {
      pcVar1 = pcVar1 + 2;
      if (pcVar2 == e) {
        pcVar1 = pcVar2;
      }
      return pcVar1;
    }
  } while ((*pcVar2 != '\\') || (pcVar2 = pcVar1 + 2, pcVar1 + 2 != e));
  return e;
}

Assistant:

static constexpr const char *skipString(const char *x, const char *e)
    {
        char delim = *x;
        x++;
        while (x != e && *x != delim) {
            if (*x == '\\') {
                x++;
                if (x == e)
                    return e;
            }
            x++;
        }
        if (x != e)
            x++;
        return x;
    }